

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O2

token * dmrC_expect_token(dmr_C *C,token *token,int op,char *where)

{
  char *pcVar1;
  token *ptVar2;
  
  if ((((ulong)token->pos & 0x3f) == 0x11) && ((token->field_2).special == op)) {
    ptVar2 = token->next;
  }
  else {
    ptVar2 = &dmrC_expect_token::bad_token;
    if (token != &dmrC_expect_token::bad_token) {
      dmrC_expect_token::bad_token.next = token;
      pcVar1 = dmrC_show_special(C,op);
      dmrC_sparse_error(C,token->pos,"Expected %s %s",pcVar1,where);
      pcVar1 = dmrC_show_token(C,token);
      dmrC_sparse_error(C,token->pos,"got %s",pcVar1);
    }
    if (op == 0x3b) {
      ptVar2 = dmrC_skip_to_token(token,0x3b);
      return ptVar2;
    }
  }
  return ptVar2;
}

Assistant:

struct token *dmrC_expect_token(struct dmr_C *C, struct token *token, int op, const char *where)
{
	if (!dmrC_match_op(token, op)) {
		static struct token bad_token;
		if (token != &bad_token) {
			bad_token.next = token;
			dmrC_sparse_error(C, token->pos, "Expected %s %s", dmrC_show_special(C, op), where);
			dmrC_sparse_error(C, token->pos, "got %s", dmrC_show_token(C, token));
		}
		if (op == ';')
			return dmrC_skip_to_token(token, op);
		return &bad_token;
	}
	return token->next;
}